

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O2

void __thiscall
ModRequestGameCommand::trigger
          (ModRequestGameCommand *this,Server *source,PlayerInfo *player,string_view parameters)

{
  _Alloc_hider _Var1;
  size_type sVar2;
  size_type __pos;
  char cVar3;
  bool bVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  undefined8 *puVar8;
  size_t sVar9;
  long *plVar10;
  long lVar11;
  long *plVar12;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  undefined1 auVar13 [16];
  basic_string_view<char,_std::char_traits<char>_> bVar14;
  uint local_f0;
  int local_ec;
  undefined1 local_b0 [2] [16];
  string user_message;
  string channel_message;
  string fmtName;
  
  sVar2 = pluginInstance.m_staffTitle._M_string_length;
  _Var1._M_p = pluginInstance.m_staffTitle._M_dataplus._M_p;
  sVar9 = parameters._M_len;
  if (sVar9 != 0) {
    RenX::getFormattedPlayerName_abi_cxx11_((PlayerInfo *)&fmtName);
    string_printf_abi_cxx11_
              (&user_message,
               "\x0312[%.*s Request] \x03\x02%.*s\x02\x0307 has requested assistance in-game for \"%.*s\"; please look in "
               ,sVar2,_Var1._M_p,fmtName._M_string_length,fmtName._M_dataplus._M_p,sVar9,
               parameters._M_str);
    string_printf_abi_cxx11_
              (&channel_message,
               "\x0312[%.*s Request] \x03\x02%.*s\x02\x0307 has requested assistance in-game! Reason: %.*s\x03"
               ,sVar2,_Var1._M_p,fmtName._M_string_length,fmtName._M_dataplus._M_p,sVar9,
               parameters._M_str);
    lVar5 = ServerManager::size();
    local_f0 = 0;
    for (lVar11 = 0; lVar11 != lVar5; lVar11 = lVar11 + 1) {
      lVar6 = ServerManager::getServer(_serverManager);
      if (lVar6 != 0) {
        lVar7 = Jupiter::IRC::Client::getChannels_abi_cxx11_();
        plVar12 = (long *)(lVar7 + 0x10);
        while (plVar12 = (long *)*plVar12, plVar12 != (long *)0x0) {
          Jupiter::IRC::Client::Channel::getType();
          cVar3 = RenX::Server::isAdminLogChanType((int)source);
          if (cVar3 != '\0') {
            auVar13 = Jupiter::IRC::Client::Channel::getName();
            Jupiter::IRC::Client::sendMessage
                      (lVar6,auVar13._0_8_,auVar13._8_8_,channel_message._M_string_length,
                       channel_message._M_dataplus._M_p);
            __pos = user_message._M_string_length;
            bVar14 = (basic_string_view<char,_std::char_traits<char>_>)
                     Jupiter::IRC::Client::Channel::getName();
            local_b0[0] = (undefined1  [16])bVar14;
            std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                      ((string *)&user_message,
                       (basic_string_view<char,_std::char_traits<char>_> *)local_b0);
            lVar7 = Jupiter::IRC::Client::Channel::getUsers_abi_cxx11_();
            plVar10 = (long *)(lVar7 + 0x10);
            local_ec = 0;
            while (plVar10 = (long *)*plVar10, plVar10 != (long *)0x0) {
              cVar3 = Jupiter::IRC::Client::Channel::getUserPrefix((User *)(plVar12 + 5));
              if (cVar3 != '\0') {
                bVar14 = (basic_string_view<char,_std::char_traits<char>_>)
                         Jupiter::IRC::Client::getNickname();
                puVar8 = (undefined8 *)Jupiter::IRC::Client::Channel::User::getNickname_abi_cxx11_()
                ;
                __y._M_str = (char *)*puVar8;
                __y._M_len = puVar8[1];
                bVar4 = std::operator==(bVar14,__y);
                if (!bVar4) {
                  puVar8 = (undefined8 *)
                           Jupiter::IRC::Client::Channel::User::getNickname_abi_cxx11_();
                  Jupiter::IRC::Client::sendMessage
                            (lVar6,puVar8[1],*puVar8,user_message._M_string_length,
                             user_message._M_dataplus._M_p);
                  local_ec = local_ec + 1;
                }
              }
            }
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                      (&user_message,__pos,0xffffffffffffffff);
            local_f0 = local_f0 + local_ec;
          }
        }
      }
    }
    string_printf_abi_cxx11_
              ((string *)local_b0,
               "A total of %u %.*ss have been notified of your assistance request.",(ulong)local_f0,
               sVar2,_Var1._M_p);
    RenX::Server::sendMessage(source,player,local_b0[0]._8_8_,local_b0[0]._0_8_);
    std::__cxx11::string::~string((string *)local_b0);
    std::__cxx11::string::~string((string *)&channel_message);
    std::__cxx11::string::~string((string *)&user_message);
    std::__cxx11::string::~string((string *)&fmtName);
    return;
  }
  RenX::Server::sendMessage
            (source,player,0x3c,"Please specify a reason for requesting moderator assistance.");
  return;
}

Assistant:

void ModRequestGameCommand::trigger(RenX::Server *source, RenX::PlayerInfo *player, std::string_view parameters) {
	if (parameters.empty()) {
		source->sendMessage(*player, "Please specify a reason for requesting moderator assistance."sv);
		return;
	}

	std::string_view staff_word = pluginInstance.getStaffTitle();
	std::string fmtName = RenX::getFormattedPlayerName(*player);
	std::string user_message = string_printf(IRCCOLOR "12[%.*s Request] " IRCCOLOR IRCBOLD "%.*s" IRCBOLD IRCCOLOR "07 has requested assistance in-game for \"%.*s\"; please look in ", staff_word.size(),
		staff_word.data(), fmtName.size(), fmtName.data(), parameters.size(),
		parameters.data());
	std::string channel_message = string_printf(IRCCOLOR "12[%.*s Request] " IRCCOLOR IRCBOLD "%.*s" IRCBOLD IRCCOLOR "07 has requested assistance in-game! Reason: %.*s" IRCCOLOR, staff_word.size(),
		staff_word.data(), fmtName.size(), fmtName.data(), parameters.size(),
		parameters.data());

	// Alerts a channel and all relevant users in the channel
	auto alert_channel = [&user_message, &channel_message](Jupiter::IRC::Client& server, const Jupiter::IRC::Client::Channel& channel) {
		// Alert channel
		server.sendMessage(channel.getName(), channel_message);

		// Alert relevant users in the channel
		unsigned int total_user_alerts{};
		size_t base_length = user_message.size();
		user_message += channel.getName();

		for (auto& user : channel.getUsers()) {
			if (channel.getUserPrefix(*user.second) != 0 // If the user has a prefix...
				&& user.second->getNickname() != server.getNickname()) { // And the user isn't this bot...
				// Alert the user
				server.sendMessage(user.second->getNickname(), user_message);
				++total_user_alerts;
			}
		}

		user_message.erase(base_length);
		return total_user_alerts;
	};

	// TODO: clean this up by just exposing a vector of servers...
	// Send off alerts
	unsigned int total_user_alerts{};
	size_t server_count = serverManager->size();
	for (size_t server_index = 0; server_index < server_count; ++server_index) {
		if (Jupiter::IRC::Client *server = serverManager->getServer(server_index)) {
			// Alert all admin channels (and their relevant users)
			for (auto& channel : server->getChannels()) {
				if (source->isAdminLogChanType(channel.second.getType())) {
					total_user_alerts += alert_channel(*server, channel.second);
				}
			}
		}
	}

	// Inform the user of the result
	source->sendMessage(*player, string_printf("A total of %u %.*ss have been notified of your assistance request.", total_user_alerts, staff_word.size(),
		staff_word.data()));
}